

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__profile_CG__technique__pass__shader
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *additionalText;
  bool bVar1;
  bool bVar2;
  ulong in_RAX;
  undefined4 *puVar3;
  StringHash SVar4;
  undefined4 uVar5;
  long lVar6;
  xmlChar **ppxVar7;
  bool failed;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  puVar3 = (undefined4 *)
           GeneratedSaxParser::StackMemoryManager::newObject
                     (&(this->
                       super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                       ).super_ParserTemplateBase.mStackMemoryManager,4);
  *puVar3 = 3;
  *attributeDataPtr = puVar3;
  ppxVar7 = attributes->attributes;
  bVar2 = true;
  if (ppxVar7 != (xmlChar **)0x0) {
    do {
      text = *ppxVar7;
      if (text == (ParserChar *)0x0) {
        validationDataPtr = (void **)0x3;
      }
      else {
        SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text);
        additionalText = ppxVar7[1];
        ppxVar7 = ppxVar7 + 2;
        if (SVar4 == 0x7aa7d5) {
          SVar4 = GeneratedSaxParser::Utils::calculateStringHash
                            (additionalText,(bool *)((long)&uStack_38 + 7));
          lVar6 = 0;
          bVar2 = false;
          do {
            if (*(StringHash *)((long)&ENUM__cg_pipeline_stageMap + lVar6) == SVar4) {
              uStack_38 = uStack_38 & 0xffffffffffffff;
              validationDataPtr = (void **)(ulong)*(uint *)((long)&DAT_0085ec68 + lVar6);
            }
            uVar5 = SUB84(validationDataPtr,0);
            if (*(StringHash *)((long)&ENUM__cg_pipeline_stageMap + lVar6) == SVar4) break;
            lVar6 = lVar6 + 0x10;
            bVar2 = lVar6 != 0x10;
          } while (lVar6 == 0x10);
          if (bVar2) {
            uStack_38 = CONCAT17(1,(undefined7)uStack_38);
            uVar5 = 2;
          }
          *puVar3 = uVar5;
          if (uStack_38._7_1_ == '\x01') {
            bVar2 = false;
            bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0x79e7ac2,0x7aa7d5,additionalText);
            if (!bVar1) goto LAB_006cc7a6;
            validationDataPtr = (void **)0x1;
          }
          else {
LAB_006cc7a6:
            validationDataPtr = (void **)0x4;
            bVar2 = true;
          }
          if (!bVar2) goto LAB_006cc79c;
        }
        else {
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_UNKNOWN_ATTRIBUTE,0x79e7ac2,text,additionalText);
          validationDataPtr = (void **)0x1;
          if (bVar2) goto LAB_006cc79c;
        }
        validationDataPtr = (void **)0x0;
      }
LAB_006cc79c:
    } while ((int)validationDataPtr == 0);
    if ((int)validationDataPtr == 3) {
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__profile_CG__technique__pass__shader( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_CG__technique__pass__shader( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_CG__technique__pass__shader__AttributeData* attributeData = newData<profile_CG__technique__pass__shader__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_stage:
    {
bool failed;
attributeData->stage = Utils::toEnum<ENUM__cg_pipeline_stage, StringHash, ENUM__cg_pipeline_stage__COUNT>(attributeValue, failed, ENUM__cg_pipeline_stageMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_SHADER,
        HASH_ATTRIBUTE_stage,
        attributeValue))
{
    return false;
}

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_SHADER, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}